

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall
ghc::filesystem::path::path<char[2],ghc::filesystem::path>(path *this,char (*source) [2],format fmt)

{
  char *in_stack_00000018;
  format in_stack_0000006c;
  path *in_stack_00000070;
  
  detail::toUtf8<char>(in_stack_00000018);
  postprocess_path_with_format(in_stack_00000070,in_stack_0000006c);
  return;
}

Assistant:

_path(detail::toWChar(source))
#else
    : _path(detail::toUtf8(source))
#endif
{
    postprocess_path_with_format(fmt);
}